

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

void __thiscall
wasm::OptimizeInstructions::optimizeStoredValue
          (OptimizeInstructions *this,Expression **value,Index bytes)

{
  bool bVar1;
  int32_t iVar2;
  Index IVar3;
  Literal *pLVar4;
  Expression *pEVar5;
  bool local_c9;
  Expression *ext;
  int32_t mask;
  Const *right;
  Binary *binary;
  Literal local_a0;
  Literal local_88;
  Literal local_60;
  Literal local_48;
  BasicType local_2c;
  Const *local_28;
  Const *c;
  Expression **ppEStack_18;
  Index bytes_local;
  Expression **value_local;
  OptimizeInstructions *this_local;
  
  c._4_4_ = bytes;
  ppEStack_18 = value;
  value_local = (Expression **)this;
  bVar1 = wasm::Type::isInteger(&(*value)->type);
  if (bVar1) {
    local_28 = Expression::dynCast<wasm::Const>(*ppEStack_18);
    if (local_28 != (Const *)0x0) {
      local_2c = i64;
      local_c9 = wasm::Type::operator==(&(*ppEStack_18)->type,&local_2c);
      local_c9 = local_c9 && c._4_4_ == 4;
      if (local_c9) {
        pLVar4 = &local_28->value;
        wasm::Literal::Literal(&local_60,0xffffffff);
        wasm::Literal::and_(&local_48,pLVar4,&local_60);
        wasm::Literal::operator=(&local_28->value,&local_48);
        wasm::Literal::~Literal(&local_48);
        wasm::Literal::~Literal(&local_60);
      }
      else {
        pLVar4 = &local_28->value;
        iVar2 = Bits::lowBitMask(c._4_4_ << 3);
        binary = (Binary *)((*ppEStack_18)->type).id;
        wasm::Literal::makeFromInt32(&local_a0,iVar2,(Type)binary);
        wasm::Literal::and_(&local_88,pLVar4,&local_a0);
        wasm::Literal::operator=(&local_28->value,&local_88);
        wasm::Literal::~Literal(&local_88);
        wasm::Literal::~Literal(&local_a0);
      }
    }
    right = (Const *)Expression::dynCast<wasm::Binary>(*ppEStack_18);
    if ((Binary *)right != (Binary *)0x0) {
      if (((Binary *)right)->op == AndInt32) {
        _mask = Expression::dynCast<wasm::Const>(((Binary *)right)->right);
        if (_mask != (Const *)0x0) {
          ext._4_4_ = 2;
          bVar1 = wasm::Type::operator==
                            (&(_mask->super_SpecificExpression<(wasm::Expression::Id)14>).
                              super_Expression.type,(BasicType *)((long)&ext + 4));
          if ((bVar1) &&
             (((iVar2 = wasm::Literal::geti32(&_mask->value), c._4_4_ == 1 && (iVar2 == 0xff)) ||
              ((c._4_4_ == 2 && (iVar2 == 0xffff)))))) {
            *ppEStack_18 = (Expression *)(right->value).field_0.func.super_IString.str._M_str;
          }
        }
      }
      else {
        pEVar5 = Properties::getSignExtValue((Expression *)right);
        if ((pEVar5 != (Expression *)0x0) &&
           (IVar3 = Properties::getSignExtBits((Expression *)right), c._4_4_ << 3 <= IVar3)) {
          *ppEStack_18 = pEVar5;
        }
      }
    }
  }
  return;
}

Assistant:

void optimizeStoredValue(Expression*& value, Index bytes) {
    if (!value->type.isInteger()) {
      return;
    }
    // truncates constant values during stores
    // (i32|i64).store(8|16|32)(p, C)   ==>
    //    (i32|i64).store(8|16|32)(p, C & mask)
    if (auto* c = value->dynCast<Const>()) {
      if (value->type == Type::i64 && bytes == 4) {
        c->value = c->value.and_(Literal(uint64_t(0xffffffff)));
      } else {
        c->value = c->value.and_(
          Literal::makeFromInt32(Bits::lowBitMask(bytes * 8), value->type));
      }
    }
    // stores of fewer bits truncates anyhow
    if (auto* binary = value->dynCast<Binary>()) {
      if (binary->op == AndInt32) {
        if (auto* right = binary->right->dynCast<Const>()) {
          if (right->type == Type::i32) {
            auto mask = right->value.geti32();
            if ((bytes == 1 && mask == 0xff) ||
                (bytes == 2 && mask == 0xffff)) {
              value = binary->left;
            }
          }
        }
      } else if (auto* ext = Properties::getSignExtValue(binary)) {
        // if sign extending the exact bit size we store, we can skip the
        // extension if extending something bigger, then we just alter bits we
        // don't save anyhow
        if (Properties::getSignExtBits(binary) >= Index(bytes) * 8) {
          value = ext;
        }
      }
    }
  }